

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgUtils.cpp
# Opt level: O2

void rsg::computeRandomValue(Random *rnd,ValueAccess dst,ConstValueRangeAccess valueRange)

{
  bool bVar1;
  ConstValueRangeAccess valueRange_00;
  ConstValueRangeAccess valueRange_01;
  int iVar2;
  TestError *this;
  int ndx;
  int iVar3;
  VariableType *pVVar4;
  float fVar5;
  StridedValueAccess<1> SVar6;
  ValueAccess dst_local;
  ConstValueRangeAccess local_78;
  ConstValueRangeAccess local_60;
  ConstValueRangeAccess local_48;
  
  dst_local.super_ConstStridedValueAccess<1>.m_value = dst.super_ConstStridedValueAccess<1>.m_value;
  pVVar4 = dst.super_ConstStridedValueAccess<1>.m_type;
  dst_local.super_ConstStridedValueAccess<1>.m_type = pVVar4;
  switch(pVVar4->m_baseType) {
  case TYPE_FLOAT:
    for (iVar3 = 0; iVar3 < pVVar4->m_numElements; iVar3 = iVar3 + 1) {
      ConstValueRangeAccess::component(&local_78,&valueRange,iVar3);
      fVar5 = (local_78.m_min)->floatVal;
      ConstValueRangeAccess::component(&local_78,&valueRange,iVar3);
      fVar5 = getQuantizedFloat(rnd,fVar5,(local_78.m_max)->floatVal,0.125);
      SVar6 = StridedValueAccess<1>::component(&dst_local,iVar3);
      (SVar6.super_ConstStridedValueAccess<1>.m_value)->floatVal = fVar5;
    }
    break;
  case TYPE_INT:
  case TYPE_SAMPLER_2D:
  case TYPE_SAMPLER_CUBE:
    for (iVar3 = 0; iVar3 < pVVar4->m_numElements; iVar3 = iVar3 + 1) {
      ConstValueRangeAccess::component(&local_78,&valueRange,iVar3);
      fVar5 = (float)(local_78.m_min)->intVal;
      ConstValueRangeAccess::component(&local_78,&valueRange,iVar3);
      iVar2 = de::Random::getInt(rnd,(int)fVar5,(local_78.m_max)->intVal);
      SVar6 = StridedValueAccess<1>::component(&dst_local,iVar3);
      (SVar6.super_ConstStridedValueAccess<1>.m_value)->intVal = iVar2;
    }
    break;
  case TYPE_BOOL:
    for (iVar3 = 0; iVar3 < pVVar4->m_numElements; iVar3 = iVar3 + 1) {
      ConstValueRangeAccess::component(&local_78,&valueRange,iVar3);
      bVar1 = (local_78.m_min)->boolVal;
      ConstValueRangeAccess::component(&local_78,&valueRange,iVar3);
      iVar2 = de::Random::getInt(rnd,(uint)bVar1,(uint)(local_78.m_min)->boolVal);
      SVar6 = StridedValueAccess<1>::component(&dst_local,iVar3);
      (SVar6.super_ConstStridedValueAccess<1>.m_value)->boolVal = iVar2 == 1;
    }
    break;
  case TYPE_STRUCT:
    iVar3 = 0;
    iVar2 = (int)(((long)(pVVar4->m_members).
                         super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pVVar4->m_members).
                        super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x28);
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    for (; iVar2 != iVar3; iVar3 = iVar3 + 1) {
      SVar6 = StridedValueAccess<1>::member(&dst_local,iVar3);
      ConstValueRangeAccess::member(&local_60,&valueRange,iVar3);
      valueRange_00.m_min = local_60.m_min;
      valueRange_00.m_type = local_60.m_type;
      valueRange_00.m_max = local_60.m_max;
      computeRandomValue(rnd,(ValueAccess)SVar6.super_ConstStridedValueAccess<1>,valueRange_00);
    }
    break;
  case TYPE_ARRAY:
    iVar3 = pVVar4->m_numElements;
    iVar2 = 0;
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    for (; iVar3 != iVar2; iVar2 = iVar2 + 1) {
      SVar6 = StridedValueAccess<1>::arrayElement(&dst_local,iVar2);
      ConstValueRangeAccess::arrayElement(&local_48,&valueRange,iVar2);
      valueRange_01.m_min = local_48.m_min;
      valueRange_01.m_type = local_48.m_type;
      valueRange_01.m_max = local_48.m_max;
      computeRandomValue(rnd,(ValueAccess)SVar6.super_ConstStridedValueAccess<1>,valueRange_01);
    }
    break;
  default:
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Invalid type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/randomshaders/rsgUtils.cpp"
               ,0x6e);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  return;
}

Assistant:

void computeRandomValue (de::Random& rnd, ValueAccess dst, ConstValueRangeAccess valueRange)
{
	const VariableType& type = dst.getType();

	switch (type.getBaseType())
	{
		case VariableType::TYPE_FLOAT:
			for (int ndx = 0; ndx < type.getNumElements(); ndx++)
			{
				const float quantizeStep = 1.0f/8.0f;
				float minVal = valueRange.component(ndx).getMin().asFloat();
				float maxVal = valueRange.component(ndx).getMax().asFloat();
				dst.component(ndx).asFloat() = getQuantizedFloat(rnd, minVal, maxVal, quantizeStep);
			}
			break;

		case VariableType::TYPE_BOOL:
			for (int ndx = 0; ndx < type.getNumElements(); ndx++)
			{
				int minVal = valueRange.component(ndx).getMin().asBool() ? 1 : 0;
				int maxVal = valueRange.component(ndx).getMin().asBool() ? 1 : 0;
				dst.component(ndx).asBool() = rnd.getInt(minVal, maxVal) == 1;
			}
			break;

		case VariableType::TYPE_INT:
		case VariableType::TYPE_SAMPLER_2D:
		case VariableType::TYPE_SAMPLER_CUBE:
			for (int ndx = 0; ndx < type.getNumElements(); ndx++)
			{
				int	minVal = valueRange.component(ndx).getMin().asInt();
				int maxVal = valueRange.component(ndx).getMax().asInt();
				dst.component(ndx).asInt() = rnd.getInt(minVal, maxVal);
			}
			break;

		case VariableType::TYPE_ARRAY:
		{
			int numElements = type.getNumElements();
			for (int ndx = 0; ndx < numElements; ndx++)
				computeRandomValue(rnd, dst.arrayElement(ndx), valueRange.arrayElement(ndx));
			break;
		}

		case VariableType::TYPE_STRUCT:
		{
			int numMembers = (int)type.getMembers().size();
			for (int ndx = 0; ndx < numMembers; ndx++)
				computeRandomValue(rnd, dst.member(ndx), valueRange.member(ndx));
			break;
		}

		default:
			TCU_FAIL("Invalid type");
	}
}